

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O3

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this,string prefix,
          string end_msg,LogFlags log_category,bool msg_on_completion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  undefined8 uVar3;
  long lVar4;
  _Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
  _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 in_register_00000011;
  long *plVar6;
  bool in_R8B;
  long in_FS_OFFSET;
  string local_50;
  long local_30;
  
  plVar6 = (long *)CONCAT71(in_register_00000011,msg_on_completion);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_start_t).
  super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_engaged = false;
  paVar1 = &(this->m_prefix).field_2;
  (this->m_prefix)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(log_category + BENCH);
  if (*(size_type **)log_category == psVar2) {
    uVar3 = *(undefined8 *)(log_category + (BENCH|HTTP));
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->m_prefix).field_2 + 8) = uVar3;
  }
  else {
    (this->m_prefix)._M_dataplus._M_p = (pointer)*(size_type **)log_category;
    (this->m_prefix).field_2._M_allocated_capacity = *psVar2;
  }
  (this->m_prefix)._M_string_length = *(size_type *)(log_category + HTTP);
  *(size_type **)log_category = psVar2;
  *(undefined8 *)(log_category + HTTP) = 0;
  *(undefined1 *)(log_category + BENCH) = 0;
  paVar1 = &(this->m_title).field_2;
  (this->m_title)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar2) {
    lVar4 = plVar6[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(long *)((long)&(this->m_title).field_2 + 8) = lVar4;
  }
  else {
    (this->m_title)._M_dataplus._M_p = (pointer)*plVar6;
    paVar1->_M_allocated_capacity = *psVar2;
  }
  (this->m_title)._M_string_length = plVar6[1];
  *plVar6 = (long)psVar2;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  this->m_log_category = (LogFlags)in_RCX;
  this->m_message_on_completion = in_R8B;
  tinyformat::format<std::__cxx11::string>
            (&local_50,(tinyformat *)"%s started",(char *)&this->m_title,in_RCX);
  Log(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  _Var5 = (_Storage<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true>
           )std::chrono::_V2::steady_clock::now();
  if ((this->m_start_t).
      super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
      ._M_engaged == false) {
    (this->m_start_t).
    super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_engaged = true;
  }
  (this->m_start_t).
  super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_payload = _Var5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Timer(
        std::string prefix,
        std::string end_msg,
        BCLog::LogFlags log_category = BCLog::LogFlags::ALL,
        bool msg_on_completion = true)
        : m_prefix(std::move(prefix)),
          m_title(std::move(end_msg)),
          m_log_category(log_category),
          m_message_on_completion(msg_on_completion)
    {
        this->Log(strprintf("%s started", m_title));
        m_start_t = std::chrono::steady_clock::now();
    }